

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_allocation_callbacks *
drwav_copy_allocation_callbacks_or_defaults
          (drwav_allocation_callbacks *__return_storage_ptr__,
          drwav_allocation_callbacks *pAllocationCallbacks)

{
  drwav_allocation_callbacks *allocationCallbacks;
  drwav_allocation_callbacks *pAllocationCallbacks_local;
  
  if (pAllocationCallbacks == (drwav_allocation_callbacks *)0x0) {
    __return_storage_ptr__->pUserData = (void *)0x0;
    __return_storage_ptr__->onMalloc = drwav__malloc_default;
    __return_storage_ptr__->onRealloc = drwav__realloc_default;
    __return_storage_ptr__->onFree = drwav__free_default;
  }
  else {
    __return_storage_ptr__->pUserData = pAllocationCallbacks->pUserData;
    __return_storage_ptr__->onMalloc = pAllocationCallbacks->onMalloc;
    __return_storage_ptr__->onRealloc = pAllocationCallbacks->onRealloc;
    __return_storage_ptr__->onFree = pAllocationCallbacks->onFree;
  }
  return __return_storage_ptr__;
}

Assistant:

static drwav_allocation_callbacks drwav_copy_allocation_callbacks_or_defaults(const drwav_allocation_callbacks* pAllocationCallbacks)
{
    if (pAllocationCallbacks != NULL) {
        /* Copy. */
        return *pAllocationCallbacks;
    } else {
        /* Defaults. */
        drwav_allocation_callbacks allocationCallbacks;
        allocationCallbacks.pUserData = NULL;
        allocationCallbacks.onMalloc  = drwav__malloc_default;
        allocationCallbacks.onRealloc = drwav__realloc_default;
        allocationCallbacks.onFree    = drwav__free_default;
        return allocationCallbacks;
    }
}